

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

shared_ptr<dap::Reader> __thiscall
dap::spy(dap *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *s,char *prefix)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::Reader> sVar4;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  puVar2 = (undefined8 *)operator_new(0x58);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00b482b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,prefix,&local_51);
  puVar2[2] = &PTR__ReaderSpy_00b48328;
  puVar2[3] = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  puVar2[4] = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  puVar2[5] = (s->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (s->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  puVar2[6] = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  puVar2[7] = puVar2 + 9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 7),local_50,local_48 + (long)local_50);
  _Var3._M_pi = extraout_RDX;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  *(undefined8 **)this = puVar2 + 2;
  *(undefined8 **)(this + 8) = puVar2;
  sVar4.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<dap::Reader>)sVar4.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reader> spy(const std::shared_ptr<Reader>& r,
                            const std::shared_ptr<Writer>& s,
                            const char* prefix /* = "\n<-" */) {
  return std::make_shared<ReaderSpy>(r, s, prefix);
}